

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O3

void __thiscall
Iir::Biquad::setTwoPole
          (Biquad *this,complex_t pole1,complex_t zero1,complex_t pole2,complex_t zero2)

{
  invalid_argument *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double a1;
  double in_XMM2_Qa;
  double dVar5;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double b1;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double b2;
  char errMsgPole [64];
  char local_98 [136];
  
  uVar4 = zero1._M_value._8_8_;
  uVar1 = zero1._M_value._0_8_;
  uVar2 = pole1._M_value._8_8_;
  uVar3 = pole1._M_value._0_8_;
  dVar5 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  builtin_strncpy(local_98 + 0x70,"mplex conjugate",0x10);
  builtin_strncpy(local_98 + 0x60,"ed to be 0 or co",0x10);
  builtin_strncpy(local_98 + 0x50,"of both poles ne",0x10);
  builtin_strncpy(local_98 + 0x40,"imaginary parts ",0x10);
  builtin_strncpy(local_98 + 0x30,"mplex conjugate",0x10);
  builtin_strncpy(local_98 + 0x20,"ed to be 0 or co",0x10);
  builtin_strncpy(local_98 + 0x10,"of both zeros ne",0x10);
  builtin_strncpy(local_98,"imaginary parts ",0x10);
  if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
    if ((in_XMM4_Qa == dVar5) && (!NAN(in_XMM4_Qa) && !NAN(dVar5))) {
      if ((-in_XMM1_Qa == in_XMM5_Qa) && (!NAN(-in_XMM1_Qa) && !NAN(in_XMM5_Qa))) {
        a1 = dVar5 * -2.0;
        dVar5 = dVar5 * dVar5 + in_XMM1_Qa * in_XMM1_Qa;
        goto LAB_00103d39;
      }
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,uVar3,uVar2,uVar1,uVar4);
    std::invalid_argument::invalid_argument(this_00,local_98 + 0x40);
  }
  else {
    if ((in_XMM5_Qa != 0.0) || (NAN(in_XMM5_Qa))) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,uVar3,uVar2,uVar1,uVar4);
      std::invalid_argument::invalid_argument(this_00,local_98 + 0x40);
      goto LAB_00103e3a;
    }
    a1 = -(dVar5 + in_XMM4_Qa);
    dVar5 = dVar5 * in_XMM4_Qa;
LAB_00103d39:
    if ((in_XMM3_Qa != 0.0) || (NAN(in_XMM3_Qa))) {
      if ((in_XMM6_Qa == in_XMM2_Qa) && (!NAN(in_XMM6_Qa) && !NAN(in_XMM2_Qa))) {
        if ((-in_XMM3_Qa == in_XMM7_Qa) && (!NAN(-in_XMM3_Qa) && !NAN(in_XMM7_Qa))) {
          b1 = in_XMM2_Qa * -2.0;
          b2 = in_XMM2_Qa * in_XMM2_Qa + in_XMM3_Qa * in_XMM3_Qa;
          goto LAB_00103db1;
        }
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,uVar3,uVar2,uVar1,uVar4);
      std::invalid_argument::invalid_argument(this_00,local_98);
    }
    else {
      if ((in_XMM7_Qa == 0.0) && (!NAN(in_XMM7_Qa))) {
        b1 = -(in_XMM2_Qa + in_XMM6_Qa);
        b2 = in_XMM2_Qa * in_XMM6_Qa;
LAB_00103db1:
        setCoefficients(this,1.0,a1,dVar5,1.0,b1,b2);
        return;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,uVar3,uVar2,uVar1,uVar4);
      std::invalid_argument::invalid_argument(this_00,local_98);
    }
  }
LAB_00103e3a:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Biquad::setTwoPole (complex_t pole1, complex_t zero1,
				     complex_t pole2, complex_t zero2)
	{
		const double a0 = 1;
		double a1;
		double a2;
		const char errMsgPole[] = "imaginary parts of both poles need to be 0 or complex conjugate";
		const char errMsgZero[] = "imaginary parts of both zeros need to be 0 or complex conjugate";

		if (pole1.imag() != 0)
		{
			if (pole2 != std::conj (pole1))
				throw_invalid_argument(errMsgPole);
			a1 = -2 * pole1.real();
			a2 = std::norm (pole1);
		}
		else
		{
			if (pole2.imag() != 0)
				throw_invalid_argument(errMsgPole);
			a1 = -(pole1.real() + pole2.real());
			a2 =   pole1.real() * pole2.real();
		}

		const double b0 = 1;
		double b1;
		double b2;

		if (zero1.imag() != 0)
		{
			if (zero2 != std::conj (zero1))
				throw_invalid_argument(errMsgZero);
			b1 = -2 * zero1.real();
			b2 = std::norm (zero1);
		}
		else
		{
			if (zero2.imag() != 0)
				throw_invalid_argument(errMsgZero);

			b1 = -(zero1.real() + zero2.real());
			b2 =   zero1.real() * zero2.real();
		}

		setCoefficients (a0, a1, a2, b0, b1, b2);
	}